

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    string *filename,LodePNGColorType colortype,uint bitdepth)

{
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint error;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string *filename_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  uint local_4;
  
  filename_00 = (string *)&stack0xffffffffffffffb8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cd341);
  *in_RDX = 0;
  *in_RSI = 0;
  local_4 = load_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),filename_00);
  if (local_4 == 0) {
    local_4 = decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_R8D,in_R9D),(uint *)in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,LCT_GREY,
                     in_stack_ffffffffffffffb0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,1));
  return local_4;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const std::string& filename,
                LodePNGColorType colortype, unsigned bitdepth) {
  std::vector<unsigned char> buffer;
  /* safe output values in case error happens */
  w = h = 0;
  unsigned error = load_file(buffer, filename);
  if(error) return error;
  return decode(out, w, h, buffer, colortype, bitdepth);
}